

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# altrace_cli.c
# Opt level: O0

void run_alGenBuffers(CallerInfo *callerinfo,ALsizei n,ALuint *orignames,ALuint *names)

{
  ALuint *__s;
  ALuint *realnames;
  ALsizei i;
  ALuint *names_local;
  ALuint *orignames_local;
  ALsizei n_local;
  CallerInfo *callerinfo_local;
  
  __s = (ALuint *)get_ioblob((long)n << 2);
  memset(__s,0,(long)n << 2);
  (*REAL_alGenBuffers)(n,__s);
  for (realnames._4_4_ = 0; realnames._4_4_ < n; realnames._4_4_ = realnames._4_4_ + 1) {
    if ((__s[realnames._4_4_] == 0) && (names[realnames._4_4_] != 0)) {
      fprintf(_stderr,"Uhoh, we didn\'t generate enough buffers!\n");
      fprintf(_stderr,"This is probably going to cause playback problems.\n");
    }
    else if ((names[realnames._4_4_] != 0) && (__s[realnames._4_4_] != 0)) {
      add_buffer_to_map(names[realnames._4_4_],__s[realnames._4_4_]);
    }
  }
  return;
}

Assistant:

static void run_alGenBuffers(CallerInfo *callerinfo, ALsizei n, ALuint *orignames, ALuint *names)
{
    ALsizei i;
    ALuint *realnames = (ALuint *) get_ioblob(sizeof (ALuint) * n);
    memset(realnames, '\0', sizeof (ALuint) * n);
    REAL_alGenBuffers(n, realnames);
    for (i = 0; i < n; i++) {
        if (!realnames[i] && names[i]) {
            fprintf(stderr, "Uhoh, we didn't generate enough buffers!\n");
            fprintf(stderr, "This is probably going to cause playback problems.\n");
        } else if (names[i] && realnames[i]) {
            add_buffer_to_map(names[i], realnames[i]);
        }
    }
}